

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8255.hpp
# Opt level: O3

void __thiscall
Intel::i8255::i8255<AmstradCPC::i8255PortHandler>::update_outputs
          (i8255<AmstradCPC::i8255PortHandler> *this)

{
  uint8_t r;
  i8255PortHandler *piVar1;
  AYDeferrer *queue;
  long lVar2;
  long lVar3;
  
  if ((this->control_ & 0x10) == 0) {
    piVar1 = this->port_handler_;
    r = this->outputs_[0];
    queue = piVar1->ay_;
    lVar2 = (queue->cycles_since_update_).super_WrappedInt<HalfCycles>.length_;
    lVar3 = lVar2 + 7;
    if (-1 < lVar2) {
      lVar3 = lVar2;
    }
    (queue->cycles_since_update_).super_WrappedInt<HalfCycles>.length_ = lVar2 % 8;
    Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<true>_>::run_for
              (&queue->speaker_,&queue->audio_queue_,(Cycles)(lVar3 >> 3));
    GI::AY38910::AY38910SampleSource<true>::set_data_input
              (&(piVar1->ay_->ay_).super_AY38910SampleSource<true>,r);
  }
  AmstradCPC::i8255PortHandler::set_value(this->port_handler_,2,this->outputs_[2]);
  return;
}

Assistant:

void update_outputs() {
			if(!(control_ & 0x10)) port_handler_.set_value(0, outputs_[0]);
			if(!(control_ & 0x02)) port_handler_.set_value(1, outputs_[1]);
			port_handler_.set_value(2, outputs_[2]);
		}